

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  bool bVar1;
  Diagnostic *this_00;
  string_view __x;
  SourceRange range;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  
  __x = Token::valueText(&pragma->name);
  __y._M_str = "protect";
  __y._M_len = 7;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    applyProtectPragma(this,pragma,skippedTokens);
    return;
  }
  __y_00._M_str = "reset";
  __y_00._M_len = 5;
  bVar1 = std::operator==(__x,__y_00);
  if (bVar1) {
    applyResetPragma(this,pragma);
    return;
  }
  __y_01._M_str = "resetall";
  __y_01._M_len = 8;
  bVar1 = std::operator==(__x,__y_01);
  if (bVar1) {
    applyResetAllPragma(this,pragma);
    return;
  }
  __y_02._M_str = "once";
  __y_02._M_len = 4;
  bVar1 = std::operator==(__x,__y_02);
  if (bVar1) {
    applyOncePragma(this,pragma);
    return;
  }
  __y_03._M_str = "diagnostic";
  __y_03._M_len = 10;
  bVar1 = std::operator==(__x,__y_03);
  if (bVar1) {
    applyDiagnosticPragma(this,pragma);
    return;
  }
  range = Token::range(&pragma->name);
  this_00 = addDiag(this,(DiagCode)0x2b0004,range);
  Diagnostic::operator<<(this_00,__x);
  return;
}

Assistant:

void Preprocessor::applyPragma(const PragmaDirectiveSyntax& pragma,
                               SmallVectorBase<Token>& skippedTokens) {
    std::string_view name = pragma.name.valueText();
    if (name == "protect") {
        applyProtectPragma(pragma, skippedTokens);
        return;
    }

    if (name == "reset") {
        applyResetPragma(pragma);
        return;
    }

    if (name == "resetall") {
        applyResetAllPragma(pragma);
        return;
    }

    if (name == "once") {
        applyOncePragma(pragma);
        return;
    }

    if (name == "diagnostic") {
        applyDiagnosticPragma(pragma);
        return;
    }

    // Otherwise, if the pragma is unknown warn and ignore.
    addDiag(diag::UnknownPragma, pragma.name.range()) << name;
}